

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

Fad<double> * __thiscall
Fad<double>::operator=
          (Fad<double> *this,
          FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
          *fadexpr)

{
  double dVar1;
  uint uVar2;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_Fad<double>_>_>
  *pFVar3;
  Fad<double> *pFVar4;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_Fad<double>_>_>,_FadCst<double>_>_>
  *pFVar5;
  bool bVar6;
  uint uVar7;
  double *pdVar8;
  double *pdVar9;
  long lVar10;
  int i;
  ulong uVar11;
  value_type vVar12;
  value_type vVar13;
  
  uVar7 = FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_Fad<double>_>
          ::size(&((((fadexpr->fadexpr_).right_)->fadexpr_).left_)->fadexpr_);
  uVar2 = (this->dx_).num_elts;
  if (uVar7 != uVar2) {
    if (uVar7 == 0) {
      if (uVar2 != 0) {
        pdVar8 = (this->dx_).ptr_to_data;
        if (pdVar8 != (double *)0x0) {
          operator_delete__(pdVar8);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
    }
    else {
      if (uVar2 != 0) {
        pdVar8 = (this->dx_).ptr_to_data;
        if (pdVar8 != (double *)0x0) {
          operator_delete__(pdVar8);
        }
        (this->dx_).num_elts = 0;
        (this->dx_).ptr_to_data = (double *)0x0;
      }
      (this->dx_).num_elts = uVar7;
      uVar11 = 0xffffffffffffffff;
      if (-1 < (int)uVar7) {
        uVar11 = (long)(int)uVar7 << 3;
      }
      pdVar8 = (double *)operator_new__(uVar11);
      (this->dx_).ptr_to_data = pdVar8;
    }
  }
  if (uVar7 != 0) {
    pdVar8 = (this->dx_).ptr_to_data;
    pFVar3 = (((fadexpr->fadexpr_).right_)->fadexpr_).left_;
    bVar6 = FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>
            ::hasFastAccess(&((pFVar3->fadexpr_).left_)->fadexpr_);
    if ((bVar6) && ((((pFVar3->fadexpr_).right_)->dx_).num_elts != 0)) {
      if (0 < (int)uVar7) {
        uVar11 = 0;
        do {
          pFVar3 = (((fadexpr->fadexpr_).right_)->fadexpr_).left_;
          vVar12 = FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>
                   ::fastAccessDx(&((pFVar3->fadexpr_).left_)->fadexpr_,(int)uVar11);
          pdVar8[uVar11] =
               (vVar12 + (((pFVar3->fadexpr_).right_)->dx_).ptr_to_data[uVar11]) *
               (fadexpr->fadexpr_).left_.constant_;
          uVar11 = uVar11 + 1;
        } while (uVar7 != uVar11);
      }
    }
    else if (0 < (int)uVar7) {
      i = 0;
      lVar10 = 0;
      do {
        pFVar3 = (((fadexpr->fadexpr_).right_)->fadexpr_).left_;
        vVar12 = FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>
                 ::dx(&((pFVar3->fadexpr_).left_)->fadexpr_,i);
        pFVar4 = (pFVar3->fadexpr_).right_;
        pdVar9 = &pFVar4->defaultVal;
        if ((pFVar4->dx_).num_elts != 0) {
          pdVar9 = (double *)((long)(pFVar4->dx_).ptr_to_data + lVar10);
        }
        *(double *)((long)pdVar8 + lVar10) =
             (vVar12 + *pdVar9) * (fadexpr->fadexpr_).left_.constant_;
        lVar10 = lVar10 + 8;
        i = i + 1;
      } while ((ulong)uVar7 << 3 != lVar10);
    }
  }
  dVar1 = (fadexpr->fadexpr_).left_.constant_;
  pFVar5 = (fadexpr->fadexpr_).right_;
  vVar13 = FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>,_Fad<double>_>
           ::val(&((pFVar5->fadexpr_).left_)->fadexpr_);
  this->val_ = (vVar13 - (pFVar5->fadexpr_).right_.constant_) * dVar1;
  return this;
}

Assistant:

inline Fad<T> & Fad<T>::operator=(const FadExpr<ExprT>& fadexpr) 
{
  int sz = fadexpr.size();

  if ( sz != dx_.size() ) dx_.resize(sz);

  if ( sz ) {
    T* RESTRICT dxp = dx_.begin();
    if (fadexpr.hasFastAccess())
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.fastAccessDx(i);
    else
      for(int i=0; i<sz; ++i)
	dxp[i] = fadexpr.dx(i);
  }
  
  val_ = fadexpr.val();
  
  return *this;
}